

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

bool __thiscall
InsertProxyModel::setItemData(InsertProxyModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar3;
  QMap<int,_QVariant> *pQVar4;
  undefined1 uVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long *plVar13;
  long *plVar14;
  RolesContainer *this_00;
  iterator iVar15;
  _Base_ptr p_Var16;
  const_iterator cVar17;
  QVariant *pQVar18;
  _Base_ptr p_Var19;
  _Rb_tree_node_base *p_Var20;
  const_iterator cVar21;
  byte bVar22;
  byte bVar23;
  QVector<int> changedRoles;
  QVector<int> local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  InsertProxyModelPrivate *local_48;
  _Base_ptr *local_40;
  QMap<int,_QVariant> *local_38;
  
  if (index->r < 0) {
    return (bool)0;
  }
  if (index->c < 0) {
    return (bool)0;
  }
  if (index->m == (QAbstractItemModel *)0x0) {
    return (bool)0;
  }
  lVar12 = QAbstractProxyModel::sourceModel();
  if (lVar12 != 0) {
    local_38 = roles;
    plVar13 = (long *)QAbstractProxyModel::sourceModel();
    local_78.d.d = (Data *)0xffffffffffffffff;
    local_78.d.ptr = (int *)0x0;
    local_78.d.size = 0;
    iVar9 = (**(code **)(*plVar13 + 0x78))(plVar13,&local_78);
    plVar13 = (long *)QAbstractProxyModel::sourceModel();
    local_78.d.d = (Data *)0xffffffffffffffff;
    local_78.d.ptr = (int *)0x0;
    local_78.d.size = 0;
    iVar10 = (**(code **)(*plVar13 + 0x80))(plVar13,&local_78);
    local_48 = this->m_dptr;
    pQVar2 = index->m;
    if (pQVar2 == (QAbstractItemModel *)0x0) {
      local_78.d.d = (Data *)0xffffffffffffffff;
      local_78.d.ptr = (int *)0x0;
      local_78.d.size = 0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x68))(&local_78,pQVar2,index);
      if (((-1 < (int)local_78.d.d) && (-1 < (long)local_78.d.d)) && (local_78.d.size != 0)) {
        return (bool)0;
      }
    }
    pQVar4 = local_38;
    iVar11 = index->r;
    if ((((iVar11 <= iVar9) && (iVar1 = index->c, iVar1 <= iVar10)) &&
        ((iVar11 != iVar9 || (((local_48->m_insertDirection).i & 1) != 0)))) &&
       ((iVar1 != iVar10 || (((local_48->m_insertDirection).i & 2) != 0)))) {
      if (iVar11 == iVar9) {
        bVar22 = (byte)(local_48->m_insertDirection).i & 1;
      }
      else {
        bVar22 = 0;
      }
      if (iVar1 == iVar10) {
        bVar23 = ((byte)(local_48->m_insertDirection).i & 2) >> 1;
      }
      else {
        bVar23 = 0;
      }
      if (bVar22 == 0 && bVar23 == 0) {
        plVar13 = (long *)QAbstractProxyModel::sourceModel();
        plVar14 = (long *)QAbstractProxyModel::sourceModel();
        local_60 = 0xffffffffffffffff;
        local_58 = 0;
        uStack_50 = 0;
        (**(code **)(*plVar14 + 0x60))(&local_78,plVar14,index->r,index->c);
        uVar5 = (**(code **)(*plVar13 + 0xb8))(plVar13,&local_78,pQVar4);
        return (bool)uVar5;
      }
      if ((bVar23 & bVar22) == 1) {
        this_00 = &local_48->m_dataForCorner;
      }
      else {
        if (bVar22 != 0) {
          iVar11 = iVar1;
        }
        this_00 = QList<QMap<int,_QVariant>_>::operator[]
                            (local_48->m_extraData + bVar22,(long)iVar11);
      }
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (int *)0x0;
      local_78.d.size = 0;
      pQVar3 = (pQVar4->d).d;
      if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var16 = (_Base_ptr)0x0;
      }
      else {
        p_Var16 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var19 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var19 = (_Base_ptr)0x0;
      }
      if (p_Var16 != p_Var19) {
        do {
          local_60 = *(ulong *)(p_Var16 + 2) & 0xfffffffffffffffc;
          cVar6 = QMetaType::isValid();
          if (cVar6 != '\0') {
            p_Var20 = p_Var16 + 1;
            iVar15 = QMap<int,_QVariant>::find(this_00,(int *)p_Var20);
            QMap<int,_QVariant>::detach(this_00);
            local_40 = &p_Var16[1]._M_parent;
            if (iVar15.i._M_node ==
                (iterator)&(((this_00->d).d)->m)._M_t._M_impl.super__Rb_tree_header) {
              local_60 = *(ulong *)(p_Var16 + 2) & 0xfffffffffffffffc;
              cVar6 = QMetaType::isValid();
              if (cVar6 != '\0') {
                local_60 = CONCAT44(local_60._4_4_,p_Var20->_M_color);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_60);
                QMap<int,_QVariant>::detach(this_00);
                std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
                ::insert_or_assign<QVariant_const&>
                          ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
                            *)&((this_00->d).d)->m,(key_type *)p_Var20,(QVariant *)local_40);
              }
            }
            else {
              local_60 = *(ulong *)(p_Var16 + 2) & 0xfffffffffffffffc;
              cVar6 = QMetaType::isValid();
              if (cVar6 == '\0') {
                local_60 = CONCAT44(local_60._4_4_,p_Var20->_M_color);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_60);
                cVar17.i._M_node =
                     (const_iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)iVar15.i._M_node)
                ;
                QMap<int,_QVariant>::erase(this_00,(const_iterator)iVar15.i._M_node,cVar17);
              }
              else {
                cVar6 = ::QVariant::equals((QVariant *)((long)iVar15.i._M_node + 0x28));
                if (cVar6 == '\0') {
                  local_60 = CONCAT44(local_60._4_4_,p_Var20->_M_color);
                  QtPrivate::QPodArrayOps<int>::emplace<int&>
                            ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_60);
                  ::QVariant::operator=
                            ((QVariant *)((long)iVar15.i._M_node + 0x28),(QVariant *)local_40);
                }
              }
            }
          }
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          pQVar3 = (local_38->d).d;
          p_Var20 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            p_Var20 = (_Rb_tree_node_base *)0x0;
          }
        } while (p_Var16 != p_Var20);
        if (local_78.d.size != 0) {
          local_60 = local_60 & 0xffffffff00000000;
          bVar7 = std::binary_search<QList<int>::const_iterator,Qt::ItemDataRole>
                            ((const_iterator)local_78.d.ptr,
                             (const_iterator)(local_78.d.ptr + local_78.d.size),
                             (ItemDataRole *)&local_60);
          local_60 = CONCAT44(local_60._4_4_,2);
          bVar8 = std::binary_search<QList<int>::const_iterator,Qt::ItemDataRole>
                            ((const_iterator)local_78.d.ptr,
                             (const_iterator)(local_78.d.ptr + local_78.d.size),
                             (ItemDataRole *)&local_60);
          if (local_48->m_separateEditDisplay == false) {
            if (bVar7 && bVar8) {
              local_60 = local_60 & 0xffffffff00000000;
              cVar17 = QMap<int,_QVariant>::find(this_00,(int *)&local_60);
              local_60 = CONCAT44(local_60._4_4_,2);
              iVar15 = QMap<int,_QVariant>::find(this_00,(int *)&local_60);
              pQVar3 = (this_00->d).d;
              cVar21._M_node = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
              if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                             *)0x0) {
                cVar21._M_node = (_Base_ptr)0x0;
              }
              if (cVar17.i._M_node == (const_iterator)cVar21._M_node) {
                QMap<int,_QVariant>::detach(this_00);
                if (iVar15.i._M_node !=
                    (iterator)&(((this_00->d).d)->m)._M_t._M_impl.super__Rb_tree_header) {
                  cVar17.i._M_node =
                       (const_iterator)
                       std::_Rb_tree_increment((_Rb_tree_node_base *)iVar15.i._M_node);
                  QMap<int,_QVariant>::erase(this_00,(const_iterator)iVar15.i._M_node,cVar17);
                }
              }
              else {
                QMap<int,_QVariant>::detach(this_00);
                if (iVar15.i._M_node ==
                    (iterator)&(((this_00->d).d)->m)._M_t._M_impl.super__Rb_tree_header) {
                  local_60 = CONCAT44(local_60._4_4_,2);
                  QMap<int,_QVariant>::detach(this_00);
                  std::
                  map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
                  insert_or_assign<QVariant_const&>
                            ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
                              *)&((this_00->d).d)->m,(key_type *)&local_60,
                             (QVariant *)((long)cVar17.i._M_node + 0x28));
                }
                else {
                  ::QVariant::operator=
                            ((QVariant *)((long)iVar15.i._M_node + 0x28),
                             (QVariant *)((long)cVar17.i._M_node + 0x28));
                }
              }
            }
            else if (bVar7 != bVar8) {
              if (bVar7) {
                local_60 = (ulong)local_60._4_4_ << 0x20;
                cVar17 = QMap<int,_QVariant>::find(this_00,(int *)&local_60);
                pQVar3 = (this_00->d).d;
                cVar21._M_node = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
                if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                               *)0x0) {
                  cVar21._M_node = (_Base_ptr)0x0;
                }
                if (cVar17.i._M_node == (const_iterator)cVar21._M_node) {
                  local_60 = CONCAT44(local_60._4_4_,2);
                  QMap<int,_QVariant>::remove(this_00,(char *)&local_60);
                }
                else {
                  local_60 = CONCAT44(local_60._4_4_,2);
                  pQVar18 = QMap<int,_QVariant>::operator[](this_00,(int *)&local_60);
                  ::QVariant::operator=(pQVar18,(QVariant *)((long)cVar17.i._M_node + 0x28));
                }
                local_60 = CONCAT44(local_60._4_4_,2);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_60);
              }
              else {
                local_60._0_4_ = EditRole;
                cVar17 = QMap<int,_QVariant>::find(this_00,(int *)&local_60);
                pQVar3 = (this_00->d).d;
                cVar21._M_node = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
                if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                               *)0x0) {
                  cVar21._M_node = (_Base_ptr)0x0;
                }
                if (cVar17.i._M_node == (const_iterator)cVar21._M_node) {
                  local_60 = (ulong)local_60._4_4_ << 0x20;
                  QMap<int,_QVariant>::remove(this_00,(char *)&local_60);
                }
                else {
                  local_60 = (ulong)local_60._4_4_ << 0x20;
                  pQVar18 = QMap<int,_QVariant>::operator[](this_00,(int *)&local_60);
                  ::QVariant::operator=(pQVar18,(QVariant *)((long)cVar17.i._M_node + 0x28));
                }
                local_60 = local_60 & 0xffffffff00000000;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)&local_60);
              }
            }
          }
          QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList *)index);
          extraDataChanged(this,index,index,&local_78);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,8);
        }
      }
      return (bool)1;
    }
  }
  return false;
}

Assistant:

bool InsertProxyModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;
    if (!sourceModel())
        return false;
    const int sourceRows = sourceModel()->rowCount();
    const int sourceCols = sourceModel()->columnCount();
    Q_D(InsertProxyModel);
    if (index.parent().isValid() || index.row() > sourceRows || index.column() > sourceCols
        || (index.row() == sourceRows && !(d->m_insertDirection & InsertRow))
        || (index.column() == sourceCols && !(d->m_insertDirection & InsertColumn)))
        return false;
    const bool isExtraRow = index.row() == sourceRows && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceCols && d->m_insertDirection & InsertColumn;
    if (!(isExtraRow || isExtraCol))
        return sourceModel()->setItemData(sourceModel()->index(index.row(), index.column()), roles);

    const int sectionIdx = isExtraRow ? index.column() : index.row();
    RolesContainer *const dataContainer = (isExtraRow && isExtraCol) ? &d->m_dataForCorner : &d->m_extraData[isExtraRow][sectionIdx];
    QVector<int> changedRoles;
    for (auto i = roles.cbegin(); i != roles.cend(); ++i) {
        if (i.value().isValid()) {
            const auto oldDataIter = dataContainer->find(i.key());
            if (oldDataIter == dataContainer->end()) {
                if (i.value().isValid()) {
                    changedRoles << i.key();
                    dataContainer->insert(i.key(), i.value());
                }
            } else if (!i.value().isValid()) {
                changedRoles << i.key();
                dataContainer->erase(oldDataIter);
                continue;
            } else if (oldDataIter.value() != i.value()) {
                changedRoles << i.key();
                oldDataIter.value() = i.value();
            }
        }
    }
    if (changedRoles.isEmpty())
        return true;
    Q_ASSERT(std::is_sorted(changedRoles.cbegin(), changedRoles.cend()));
    const bool hasDisplay = std::binary_search(changedRoles.cbegin(), changedRoles.cend(), Qt::DisplayRole);
    const bool hasEdit = std::binary_search(changedRoles.cbegin(), changedRoles.cend(), Qt::EditRole);
    if (!d->m_separateEditDisplay) {
        if (hasDisplay && hasEdit) {
            const auto displayIter = dataContainer->constFind(Qt::DisplayRole);
            const auto editIter = dataContainer->find(Qt::EditRole);
            // in QStandardItemModel DisplayRole wins over EditRole so we do the same
            if (displayIter == dataContainer->cend()) {
                if (editIter != dataContainer->end()) {
                    dataContainer->erase(editIter);
                }
            } else {
                if (editIter == dataContainer->end())
                    dataContainer->insert(Qt::EditRole, displayIter.value());
                else
                    editIter.value() = displayIter.value(); // assign without checking should optimise memory use due to implicit sharing
            }
        } else if (hasDisplay != hasEdit) {
            if (hasDisplay) {
                const auto displayIter = dataContainer->constFind(Qt::DisplayRole);
                if (displayIter == dataContainer->constEnd()) {
                    Q_ASSERT(dataContainer->contains(Qt::EditRole));
                    dataContainer->remove(Qt::EditRole);
                } else {
                    dataContainer->operator[](Qt::EditRole) = displayIter.value();
                }
                changedRoles << Qt::EditRole;
            } else {
                const auto editIter = dataContainer->constFind(Qt::EditRole);
                if (editIter == dataContainer->constEnd()) {
                    Q_ASSERT(dataContainer->contains(Qt::DisplayRole));
                    dataContainer->remove(Qt::DisplayRole);
                } else {
                    dataContainer->operator[](Qt::DisplayRole) = editIter.value();
                }
                changedRoles << Qt::DisplayRole;
            }
        }
    }
    Q_EMIT dataChanged(index, index, changedRoles);
    Q_EMIT extraDataChanged(index, index, changedRoles);
    return true;
}